

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_BtFindBestMatch_selectMLS
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iLimit,
                 size_t *offsetPtr)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = cParams->searchLength - 5;
  if (uVar1 < 3) {
    sVar2 = ZSTD_BtFindBestMatch
                      (ms,cParams,ip,iLimit,offsetPtr,*(U32 *)(&DAT_00179e70 + (ulong)uVar1 * 4));
    return sVar2;
  }
  sVar2 = ZSTD_BtFindBestMatch(ms,cParams,ip,iLimit,offsetPtr,4);
  return sVar2;
}

Assistant:

static size_t ZSTD_BtFindBestMatch_selectMLS (
                        ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(cParams->searchLength)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_BtFindBestMatch(ms, cParams, ip, iLimit, offsetPtr, 4);
    case 5 : return ZSTD_BtFindBestMatch(ms, cParams, ip, iLimit, offsetPtr, 5);
    case 7 :
    case 6 : return ZSTD_BtFindBestMatch(ms, cParams, ip, iLimit, offsetPtr, 6);
    }
}